

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O1

decNumber *
decCompareOp(decNumber *res,decNumber *lhs,decNumber *rhs,decContext *set,uint8_t op,
            uint32_t *status)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  uint in_EAX;
  uint uVar7;
  long lVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined7 in_register_00000081;
  int32_t residue;
  undefined8 uStack_38;
  
  uVar12 = (uint)CONCAT71(in_register_00000081,op);
  uStack_38._0_4_ = in_EAX;
  if (uVar12 == 4) {
    if ((char)lhs->bits < '\0') {
      uVar7 = 0xffffffff;
      if (-1 < (char)rhs->bits) goto LAB_00251d37;
      if ((char)lhs->bits < '\0') goto LAB_00251c3f;
    }
    if ((char)rhs->bits < '\0') {
      uVar7 = 1;
      goto LAB_00251d37;
    }
  }
LAB_00251c3f:
  bVar9 = lhs->bits;
  bVar1 = rhs->bits;
  if (((bVar1 | bVar9) & 0x30) == 0) {
    uVar7 = decCompare(lhs,rhs,(byte)(op - 7) < 2);
    goto LAB_00251d37;
  }
  if (op != '\x01') {
    if (op == '\x06') {
      *status = *status | 0x40000080;
    }
    else {
      if (op == '\x04') {
        uVar10 = 0xffffffff;
        if ((bVar9 & 0x30) != 0) {
          if ((bVar1 & 0x30) != 0) {
            if (((uint)(bVar9 >> 4) & (bVar1 & 0x20) >> 5) != 0) goto LAB_00251d1e;
            if (((bVar9 & 0x20) == 0) || ((bVar1 & 0x10) == 0)) {
              uVar7 = lhs->digits;
              if ((long)(int)uVar7 < 0x32) {
                uVar7 = (uint)""[(int)uVar7];
              }
              uVar11 = rhs->digits;
              if ((long)(int)uVar11 < 0x32) {
                uVar11 = (uint)""[(int)uVar11];
              }
              if (uVar7 <= uVar11) {
                if (uVar11 <= uVar7) {
                  lVar8 = (ulong)uVar7 + 9;
                  do {
                    if (lVar8 < 10) {
                      uVar10 = 0;
                      break;
                    }
                    lVar5 = lVar8 + -10;
                    lVar6 = lVar8 + -10;
                    if (rhs->lsu[lVar6] < lhs->lsu[lVar5]) goto LAB_00251d19;
                    lVar8 = lVar8 + -1;
                  } while (rhs->lsu[lVar6] <= lhs->lsu[lVar5]);
                }
                goto LAB_00251d1e;
              }
            }
          }
LAB_00251d19:
          uVar10 = 1;
        }
LAB_00251d1e:
        uVar7 = -uVar10;
        if (-1 < (char)bVar9) {
          uVar7 = uVar10;
        }
        goto LAB_00251d37;
      }
      if ((((bVar1 | bVar9) & 0x10) == 0) && ((bVar9 & 0x30) == 0 || (bVar1 & 0x30) == 0)) {
        uVar12 = 2;
        uVar7 = -(bVar9 >> 5 & 1) | 1;
        goto LAB_00251d37;
      }
    }
  }
  decNaNs(res,lhs,rhs,set,status);
  uVar12 = 5;
  uVar7 = 0;
LAB_00251d37:
  switch(uVar12 & 0xff) {
  case 1:
  case 4:
  case 6:
    if (uVar7 == 0 && (char)uVar12 == '\x04') {
      iVar2 = rhs->exponent;
      iVar3 = lhs->exponent;
      uVar7 = 0;
      if (iVar3 != iVar2) {
        uVar7 = (uint)(iVar2 <= iVar3) * -2 + 1;
        if (-1 < (char)lhs->bits) {
          uVar7 = (uint)(iVar2 <= iVar3) * 2 - 1;
        }
      }
    }
    res->bits = '\0';
    res->lsu[0] = '\0';
    res->digits = 1;
    res->exponent = 0;
    if ((uVar7 != 0) && (res->lsu[0] = '\x01', (int)uVar7 < 0)) {
      res->bits = 0x80;
    }
    break;
  default:
    uStack_38 = (ulong)(uint)uStack_38;
    if (uVar7 == 0) {
      bVar9 = lhs->bits & 0x80;
      if (bVar9 == (rhs->bits & 0x80)) {
        if ((char)(rhs->bits & lhs->bits) < '\0') {
          bVar4 = lhs->exponent < rhs->exponent;
        }
        else {
          bVar4 = rhs->exponent < lhs->exponent;
        }
        uVar7 = (uint)bVar4 * 2 - 1;
      }
      else {
        uVar7 = -(uint)(bVar9 != 0) | 1;
      }
    }
    if (((char)uVar12 == '\b') || ((uVar12 & 0xff) == 3)) {
      uVar7 = -uVar7;
    }
    if (0 < (int)uVar7) {
      rhs = lhs;
    }
    res->bits = rhs->bits;
    res->exponent = rhs->exponent;
    decSetCoeff(res,set,rhs->lsu,rhs->digits,(int32_t *)((long)&uStack_38 + 4),status);
    decFinalize(res,set,(int32_t *)((long)&uStack_38 + 4),status);
    break;
  case 5:
    break;
  }
  return res;
}

Assistant:

static decNumber * decCompareOp(decNumber *res, const decNumber *lhs,
                         const decNumber *rhs, decContext *set,
                         Flag op, uInt *status) {
  #if DECSUBSET
  decNumber *alloclhs=NULL;        /* non-NULL if rounded lhs allocated  */
  decNumber *allocrhs=NULL;        /* .., rhs  */
  #endif
  Int   result=0;                  /* default result value  */
  uByte merged;                    /* work  */

  #if DECCHECK
  if (decCheckOperands(res, lhs, rhs, set)) return res;
  #endif

  do {                             /* protect allocated storage  */
    #if DECSUBSET
    if (!set->extended) {
      /* reduce operands and set lostDigits status, as needed  */
      if (lhs->digits>set->digits) {
        alloclhs=decRoundOperand(lhs, set, status);
        if (alloclhs==NULL) {result=BADINT; break;}
        lhs=alloclhs;
        }
      if (rhs->digits>set->digits) {
        allocrhs=decRoundOperand(rhs, set, status);
        if (allocrhs==NULL) {result=BADINT; break;}
        rhs=allocrhs;
        }
      }
    #endif
    /* [following code does not require input rounding]  */

    /* If total ordering then handle differing signs 'up front'  */
    if (op==COMPTOTAL) {                /* total ordering  */
      if (decNumberIsNegative(lhs) && !decNumberIsNegative(rhs)) {
        result=-1;
        break;
        }
      if (!decNumberIsNegative(lhs) && decNumberIsNegative(rhs)) {
        result=+1;
        break;
        }
      }

    /* handle NaNs specially; let infinities drop through  */
    /* This assumes sNaN (even just one) leads to NaN.  */
    merged=(lhs->bits | rhs->bits) & (DECSNAN | DECNAN);
    if (merged) {                       /* a NaN bit set  */
      if (op==COMPARE);                 /* result will be NaN  */
       else if (op==COMPSIG)            /* treat qNaN as sNaN  */
        *status|=DEC_Invalid_operation | DEC_sNaN;
       else if (op==COMPTOTAL) {        /* total ordering, always finite  */
        /* signs are known to be the same; compute the ordering here  */
        /* as if the signs are both positive, then invert for negatives  */
        if (!decNumberIsNaN(lhs)) result=-1;
         else if (!decNumberIsNaN(rhs)) result=+1;
         /* here if both NaNs  */
         else if (decNumberIsSNaN(lhs) && decNumberIsQNaN(rhs)) result=-1;
         else if (decNumberIsQNaN(lhs) && decNumberIsSNaN(rhs)) result=+1;
         else { /* both NaN or both sNaN  */
          /* now it just depends on the payload  */
          result=decUnitCompare(lhs->lsu, D2U(lhs->digits),
                                rhs->lsu, D2U(rhs->digits), 0);
          /* [Error not possible, as these are 'aligned']  */
          } /* both same NaNs  */
        if (decNumberIsNegative(lhs)) result=-result;
        break;
        } /* total order  */

       else if (merged & DECSNAN);           /* sNaN -> qNaN  */
       else { /* here if MIN or MAX and one or two quiet NaNs  */
        /* min or max -- 754 rules ignore single NaN  */
        if (!decNumberIsNaN(lhs) || !decNumberIsNaN(rhs)) {
          /* just one NaN; force choice to be the non-NaN operand  */
          op=COMPMAX;
          if (lhs->bits & DECNAN) result=-1; /* pick rhs  */
                             else result=+1; /* pick lhs  */
          break;
          }
        } /* max or min  */
      op=COMPNAN;                            /* use special path  */
      decNaNs(res, lhs, rhs, set, status);   /* propagate NaN  */
      break;
      }
    /* have numbers  */
    if (op==COMPMAXMAG || op==COMPMINMAG) result=decCompare(lhs, rhs, 1);
     else result=decCompare(lhs, rhs, 0);    /* sign matters  */
    } while(0);                              /* end protected  */

  if (result==BADINT) *status|=DEC_Insufficient_storage; /* rare  */
   else {
    if (op==COMPARE || op==COMPSIG ||op==COMPTOTAL) { /* returning signum  */
      if (op==COMPTOTAL && result==0) {
        /* operands are numerically equal or same NaN (and same sign,  */
        /* tested first); if identical, leave result 0  */
        if (lhs->exponent!=rhs->exponent) {
          if (lhs->exponent<rhs->exponent) result=-1;
           else result=+1;
          if (decNumberIsNegative(lhs)) result=-result;
          } /* lexp!=rexp  */
        } /* total-order by exponent  */
      uprv_decNumberZero(res);               /* [always a valid result]  */
      if (result!=0) {                  /* must be -1 or +1  */
        *res->lsu=1;
        if (result<0) res->bits=DECNEG;
        }
      }
     else if (op==COMPNAN);             /* special, drop through  */
     else {                             /* MAX or MIN, non-NaN result  */
      Int residue=0;                    /* rounding accumulator  */
      /* choose the operand for the result  */
      const decNumber *choice;
      if (result==0) { /* operands are numerically equal  */
        /* choose according to sign then exponent (see 754)  */
        uByte slhs=(lhs->bits & DECNEG);
        uByte srhs=(rhs->bits & DECNEG);
        #if DECSUBSET
        if (!set->extended) {           /* subset: force left-hand  */
          op=COMPMAX;
          result=+1;
          }
        else
        #endif
        if (slhs!=srhs) {          /* signs differ  */
          if (slhs) result=-1;     /* rhs is max  */
               else result=+1;     /* lhs is max  */
          }
         else if (slhs && srhs) {  /* both negative  */
          if (lhs->exponent<rhs->exponent) result=+1;
                                      else result=-1;
          /* [if equal, use lhs, technically identical]  */
          }
         else {                    /* both positive  */
          if (lhs->exponent>rhs->exponent) result=+1;
                                      else result=-1;
          /* [ditto]  */
          }
        } /* numerically equal  */
      /* here result will be non-0; reverse if looking for MIN  */
      if (op==COMPMIN || op==COMPMINMAG) result=-result;
      choice=(result>0 ? lhs : rhs);    /* choose  */
      /* copy chosen to result, rounding if need be  */
      decCopyFit(res, choice, set, &residue, status);
      decFinish(res, set, &residue, status);
      }
    }
  #if DECSUBSET
  if (allocrhs!=NULL) free(allocrhs);   /* free any storage used  */
  if (alloclhs!=NULL) free(alloclhs);   /* ..  */
  #endif
  return res;
  }